

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rms_level.cc
# Opt level: O0

int __thiscall webrtc::RMSLevel::RMS(RMSLevel *this)

{
  double dVar1;
  float local_2c;
  float local_1c;
  float rms;
  RMSLevel *this_local;
  
  if ((this->sample_count_ == 0) || ((this->sum_square_ == 0.0 && (!NAN(this->sum_square_))))) {
    Reset(this);
    this_local._4_4_ = 0x7f;
  }
  else {
    local_2c = (float)this->sample_count_;
    dVar1 = std::log10((double)(ulong)(uint)(this->sum_square_ / (local_2c * 1.0737418e+09)));
    local_1c = SUB84(dVar1,0) * 10.0;
    if (0.0 < local_1c) {
      __assert_fail("rms <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/rms_level.cc"
                    ,0x34,"int webrtc::RMSLevel::RMS()");
    }
    if (local_1c < -127.0) {
      local_1c = -127.0;
    }
    Reset(this);
    this_local._4_4_ = (int)(-local_1c + 0.5);
  }
  return this_local._4_4_;
}

Assistant:

int RMSLevel::RMS() {
  if (sample_count_ == 0 || sum_square_ == 0) {
    Reset();
    return kMinLevel;
  }

  // Normalize by the max level.
  float rms = sum_square_ / (sample_count_ * kMaxSquaredLevel);
  // 20log_10(x^0.5) = 10log_10(x)
  rms = 10 * log10(rms);
  assert(rms <= 0);
  if (rms < -kMinLevel)
    rms = -kMinLevel;

  rms = -rms;
  Reset();
  return static_cast<int>(rms + 0.5);
}